

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O0

string * __thiscall
cmExportInstallFileGenerator::InstallNameDir
          (string *__return_storage_ptr__,cmExportInstallFileGenerator *this,cmTarget *target,
          string *param_2)

{
  bool bVar1;
  cmMakefile *this_00;
  string local_90;
  allocator local_69;
  string local_68;
  cmMakefile *local_38;
  cmMakefile *mf;
  string *local_28;
  string *param_2_local;
  cmTarget *target_local;
  cmExportInstallFileGenerator *this_local;
  string *install_name_dir;
  
  mf._7_1_ = 0;
  local_28 = param_2;
  param_2_local = (string *)target;
  target_local = (cmTarget *)this;
  this_local = (cmExportInstallFileGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  this_00 = cmTarget::GetMakefile((cmTarget *)param_2_local);
  local_38 = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"CMAKE_PLATFORM_HAS_INSTALLNAME",&local_69);
  bVar1 = cmMakefile::IsOn(this_00,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  if (bVar1) {
    cmTarget::GetInstallNameDirForInstallTree_abi_cxx11_(&local_90,(cmTarget *)param_2_local);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
cmExportInstallFileGenerator::InstallNameDir(cmTarget* target,
                                             const std::string&)
{
  std::string install_name_dir;

  cmMakefile* mf = target->GetMakefile();
  if(mf->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME"))
    {
    install_name_dir =
      target->GetInstallNameDirForInstallTree();
    }

  return install_name_dir;
}